

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

LinkedToken * __thiscall Cache<LinkedToken>::add(Cache<LinkedToken> *this,LinkedToken *data)

{
  reference pvVar1;
  LinkedToken *in_RSI;
  value_type *in_RDI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffffa0;
  
  freeInvalidComments((Cache<LinkedToken> *)in_stack_ffffffffffffffa0.__d.__r);
  __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)&stack0xffffffffffffffa0;
  LinkedToken::LinkedToken(in_RSI,&in_RDI->data);
  std::chrono::_V2::system_clock::now();
  std::chrono::operator+(__lhs,(duration<long,_std::ratio<1L,_1L>_> *)in_RSI);
  std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>::push_back
            ((vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_> *)in_RSI
             ,in_RDI);
  Entry::~Entry((Entry *)0x1bfd72);
  pvVar1 = std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>::back
                     ((vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
                       *)in_RSI);
  return &pvVar1->data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}